

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_MNSV_DomThisResolvesWithRespectToSelection_Test::TestBody
          (InterpreterTestSuite_MNSV_DomThisResolvesWithRespectToSelection_Test *this)

{
  size_type sVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  Registry *pRVar4;
  Status SVar5;
  bool bVar6;
  char *pcVar7;
  char *message;
  size_type *psVar8;
  Status local_48a;
  Status local_489;
  string local_488;
  string local_468;
  undefined1 local_440 [40];
  _Alloc_hider local_418;
  size_type *local_408 [2];
  string local_3f8;
  internal local_3d8 [8];
  undefined8 *local_3d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  Expression ret;
  string local_380;
  State local_360;
  State local_35c;
  ByteArray local_358;
  ByteArray local_338;
  char *local_320;
  string local_318;
  UnixTime local_2f8;
  UnixTime local_2f0;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  pRVar4 = ctx.mRegistry;
  local_440._0_8_ = local_440 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"127.0.0.1","");
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"1.1","");
  ot::commissioner::BorderAgent::State::State(&local_35c,0,0,0,0,0);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"net1","");
  ret.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&ret.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"");
  nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nids,"");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"");
  local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"domain1","");
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  pcVar7 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"","");
  ot::commissioner::UnixTime::UnixTime(&local_2f0,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&br,(string *)local_440,0x4e21,&local_338,&local_488,local_35c,
             &local_3f8,1,(string *)&ret,(string *)&nids,(Timestamp)0x0,0,&local_468,&local_358,
             &local_380,'\0',0,&local_318,local_2f0,0x103f);
  local_489 = ot::commissioner::persistent_storage::Registry::Add(pRVar4,(BorderAgent *)&br);
  local_48a = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            (local_3d8,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_489,&local_48a);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if (local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((pointer *)
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&ret.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(ret.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
    operator_delete((void *)local_440._0_8_);
  }
  puVar3 = local_3d0;
  if (local_3d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&br);
    if (local_3d0 != (undefined8 *)0x0) {
      pcVar7 = (char *)*local_3d0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_440,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x1ea,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_440,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_440);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
    if (local_3d0 == (undefined8 *)0x0) goto LAB_0014d71f;
    if ((undefined8 *)*local_3d0 != local_3d0 + 2) {
      operator_delete((undefined8 *)*local_3d0);
    }
  }
  else {
    if (local_3d0 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3d0 != local_3d0 + 2) {
        operator_delete((undefined8 *)*local_3d0);
      }
      operator_delete(puVar3);
    }
    pRVar4 = ctx.mRegistry;
    local_440._0_8_ = local_440 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"127.0.0.2","");
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_360,0,0,0,0,0);
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"net2","");
    ret.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&ret.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"");
    nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&nids,"");
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"");
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"domain2","");
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    local_320 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318);
    ot::commissioner::UnixTime::UnixTime(&local_2f8,0);
    pcVar7 = (char *)(ulong)(uint)local_360;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)local_440,0x4e21,&local_338,&local_488,local_360,
               &local_3f8,2,(string *)&ret,(string *)&nids,(Timestamp)0x0,0,&local_468,&local_358,
               &local_380,'\0',0,&local_318,local_2f8,0x103f);
    local_489 = ot::commissioner::persistent_storage::Registry::Add(pRVar4,(BorderAgent *)&br);
    local_48a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_3d8,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_489,&local_48a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
    if (local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    if ((pointer *)
        nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (ret.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&ret.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(ret.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p);
    }
    if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_);
    }
    if (local_3d8[0] != (internal)0x0) {
      if (local_3d0 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_3d0 != local_3d0 + 2) {
          operator_delete((undefined8 *)*local_3d0);
        }
        operator_delete(local_3d0);
      }
      ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)local_440,0);
      br.mNetworkId.mId = local_440._0_4_;
      SVar5 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br);
      local_488._M_dataplus._M_p._0_1_ = SVar5;
      local_3f8._M_dataplus._M_p = local_3f8._M_dataplus._M_p & 0xffffffffffffff00;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)local_440,"ctx.mRegistry->SetCurrentNetwork(br)",
                 "RegistryStatus::kSuccess",(Status *)&local_488,(Status *)&local_3f8);
      uVar2 = local_440._8_8_;
      if (local_440[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_488);
        if ((size_type **)local_440._8_8_ == (size_type **)0x0) {
          psVar8 = (size_type *)0x2ff875;
        }
        else {
          psVar8 = *(size_type **)local_440._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_3f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1f2,(char *)psVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)&local_488)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_488._M_dataplus._M_p + 8))();
        }
        if ((size_type **)local_440._8_8_ != (size_type **)0x0) {
          if (*(size_type ***)local_440._8_8_ != (size_type **)(local_440._8_8_ + 0x10)) {
            operator_delete(*(size_type ***)local_440._8_8_);
          }
          operator_delete((void *)local_440._8_8_);
        }
      }
      else {
        if ((size_type **)local_440._8_8_ != (size_type **)0x0) {
          if (*(size_type ***)local_440._8_8_ != (size_type **)(local_440._8_8_ + 0x10)) {
            operator_delete(*(size_type ***)local_440._8_8_);
          }
          operator_delete((void *)uVar2);
        }
        local_3f8.field_2._M_allocated_capacity = 0;
        local_3f8._M_dataplus._M_p = (pointer)0x0;
        local_3f8._M_string_length = 0;
        ret.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ret.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ret.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_440._0_8_ = local_440 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"start --dom this","");
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&local_468,&ctx.mInterpreter,(string *)local_440);
        local_488.field_2._M_allocated_capacity = local_3f8.field_2._M_allocated_capacity;
        local_488._M_string_length = local_3f8._M_string_length;
        local_488._M_dataplus._M_p = local_3f8._M_dataplus._M_p;
        local_3f8.field_2._M_allocated_capacity = local_468.field_2._M_allocated_capacity;
        local_3f8._M_dataplus._M_p = local_468._M_dataplus._M_p;
        local_3f8._M_string_length = local_468._M_string_length;
        local_468._M_dataplus._M_p = (pointer)0x0;
        local_468._M_string_length = 0;
        local_468.field_2._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_488);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_468);
        if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
          operator_delete((void *)local_440._0_8_);
        }
        ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
                  ((Error *)local_440,&ctx.mInterpreter,(Expression *)&local_3f8,&ret);
        local_468._M_dataplus._M_p._0_4_ = local_440._0_4_;
        local_380._M_dataplus._M_p = local_380._M_dataplus._M_p & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                  ((internal *)&local_488,
                   "ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode()",
                   "ErrorCode::kNone",(ErrorCode *)&local_468,(ErrorCode *)&local_380);
        if ((undefined1 *)local_440._8_8_ != local_440 + 0x18) {
          operator_delete((void *)local_440._8_8_);
        }
        if ((Status)local_488._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)local_440);
          if ((undefined8 *)local_488._M_string_length == (undefined8 *)0x0) {
            message = "";
          }
          else {
            message = *(char **)local_488._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x1f7,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_468,(Message *)local_440);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
          if ((size_type **)local_440._0_8_ != (size_type **)0x0) {
            (*(code *)(*(size_type **)local_440._0_8_)[1])();
          }
        }
        sVar1 = local_488._M_string_length;
        if ((undefined8 *)local_488._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_488._M_string_length !=
              (undefined8 *)(local_488._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_488._M_string_length);
          }
          operator_delete((void *)sVar1);
        }
        ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
                  ((Value *)local_440,&ctx.mInterpreter,&ret,&nids);
        bVar6 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_440);
        local_488._M_dataplus._M_p._0_1_ = bVar6;
        local_488._M_string_length = 0;
        if ((size_type **)local_418._M_p != local_408) {
          operator_delete(local_418._M_p);
        }
        if ((undefined1 *)local_440._8_8_ != local_440 + 0x18) {
          operator_delete((void *)local_440._8_8_);
        }
        if ((Status)local_488._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_468);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_440,(internal *)&local_488,
                     (AssertionResult *)
                     "ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError()","false",
                     "true",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_380,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x1f8,(char *)local_440._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_380,(Message *)&local_468);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
          if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
            operator_delete((void *)local_440._0_8_);
          }
          if ((long *)local_468._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_468._M_dataplus._M_p + 8))();
          }
        }
        sVar1 = local_488._M_string_length;
        if ((undefined8 *)local_488._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_488._M_string_length !=
              (undefined8 *)(local_488._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_488._M_string_length);
          }
          operator_delete((void *)sVar1);
        }
        local_488._M_dataplus._M_p =
             (pointer)((long)nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
        local_468._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_440,"nids.size()","1",(unsigned_long *)&local_488,
                   (int *)&local_468);
        if (local_440[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_488);
          if ((size_type **)local_440._8_8_ == (size_type **)0x0) {
            psVar8 = (size_type *)0x2ff875;
          }
          else {
            psVar8 = *(size_type **)local_440._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x1f9,(char *)psVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_468,(Message *)&local_488);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
          if ((long *)local_488._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_488._M_dataplus._M_p + 8))();
          }
        }
        uVar2 = local_440._8_8_;
        if ((size_type **)local_440._8_8_ != (size_type **)0x0) {
          if (*(size_type ***)local_440._8_8_ != (size_type **)(local_440._8_8_ + 0x10)) {
            operator_delete(*(size_type ***)local_440._8_8_);
          }
          operator_delete((void *)uVar2);
        }
        local_488._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_440,"nids[0]","1",
                   nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,(int *)&local_488);
        if (local_440[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_488);
          if ((size_type **)local_440._8_8_ == (size_type **)0x0) {
            psVar8 = (size_type *)0x2ff875;
          }
          else {
            psVar8 = *(size_type **)local_440._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x1fa,(char *)psVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_468,(Message *)&local_488);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_488._M_dataplus._M_p + 8))();
          }
        }
        if ((size_type **)local_440._8_8_ != (size_type **)0x0) {
          if (*(size_type ***)local_440._8_8_ != (size_type **)(local_440._8_8_ + 0x10)) {
            operator_delete(*(size_type ***)local_440._8_8_);
          }
          operator_delete((void *)local_440._8_8_);
        }
        if (nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&ret);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_3f8);
      }
      br._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00395f58;
      ot::commissioner::BorderAgent::~BorderAgent(&br.mAgent);
      goto LAB_0014d71f;
    }
    testing::Message::Message((Message *)&br);
    if (local_3d0 != (undefined8 *)0x0) {
      local_320 = (char *)*local_3d0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_440,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x1ef,local_320);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_440,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_440);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
    if (local_3d0 == (undefined8 *)0x0) goto LAB_0014d71f;
    if ((undefined8 *)*local_3d0 != local_3d0 + 2) {
      operator_delete((undefined8 *)*local_3d0);
    }
  }
  operator_delete(local_3d0);
LAB_0014d71f:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNSV_DomThisResolvesWithRespectToSelection)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = NetworkId{0};
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Interpreter::Expression expr, ret;
    std::vector<uint64_t>   nids;
    expr = ctx.mInterpreter.ParseExpression("start --dom this");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_TRUE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
    EXPECT_EQ(nids.size(), 1);
    EXPECT_EQ(nids[0], 1);
}